

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_ComputeSolutions_MassFixed(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined8 *in_RSI;
  long in_RDI;
  bool bVar6;
  undefined8 uVar7;
  ARKodeARKStepMem step_mem;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  int stiffly_accurate;
  N_Vector yerr;
  N_Vector y;
  int nvec;
  int j;
  int retval;
  int local_24;
  int local_20;
  
  if (*(long *)(in_RDI + 0x88) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xd13,"arkStep_ComputeSolutions_MassFixed",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  lVar1 = *(long *)(in_RDI + 0x88);
  uVar7 = *(undefined8 *)(in_RDI + 0x248);
  uVar2 = *(undefined8 *)(in_RDI + 0x268);
  lVar3 = *(long *)(lVar1 + 0x1b0);
  lVar4 = *(long *)(lVar1 + 0x1b8);
  *in_RSI = 0;
  bVar6 = true;
  if (*(int *)(lVar1 + 0x1c) != 0) {
    iVar5 = ARKodeButcherTable_IsStifflyAccurate(*(ARKodeButcherTable *)(lVar1 + 0x70));
    bVar6 = iVar5 != 0;
  }
  if ((*(int *)(lVar1 + 0x20) != 0) &&
     (iVar5 = ARKodeButcherTable_IsStifflyAccurate(*(ARKodeButcherTable *)(lVar1 + 0x78)),
     iVar5 == 0)) {
    bVar6 = false;
  }
  if (!bVar6) {
    local_24 = 0;
    for (local_20 = 0; local_20 < *(int *)(lVar1 + 0x6c); local_20 = local_20 + 1) {
      if (*(int *)(lVar1 + 0x1c) != 0) {
        *(double *)(lVar3 + (long)local_24 * 8) =
             *(double *)(in_RDI + 0x2c0) *
             *(double *)(*(long *)(*(long *)(lVar1 + 0x70) + 0x20) + (long)local_20 * 8);
        *(undefined8 *)(lVar4 + (long)local_24 * 8) =
             *(undefined8 *)(*(long *)(lVar1 + 0x30) + (long)local_20 * 8);
        local_24 = local_24 + 1;
      }
      if (*(int *)(lVar1 + 0x20) != 0) {
        *(double *)(lVar3 + (long)local_24 * 8) =
             *(double *)(in_RDI + 0x2c0) *
             *(double *)(*(long *)(*(long *)(lVar1 + 0x78) + 0x20) + (long)local_20 * 8);
        *(undefined8 *)(lVar4 + (long)local_24 * 8) =
             *(undefined8 *)(*(long *)(lVar1 + 0x38) + (long)local_20 * 8);
        local_24 = local_24 + 1;
      }
    }
    iVar5 = N_VLinearCombination(local_24,lVar3,lVar4,uVar7);
    if (iVar5 != 0) {
      return -0x1c;
    }
    iVar5 = (**(code **)(lVar1 + 0x168))(*(undefined8 *)(lVar1 + 0xf0),in_RDI,uVar7);
    if (iVar5 < 0) {
      *in_RSI = 0x4000000000000000;
      N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x250),uVar7);
      return 4;
    }
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x250),uVar7,uVar7);
  }
  if (*(int *)(in_RDI + 0x300) == 0) {
    local_24 = 0;
    for (local_20 = 0; local_20 < *(int *)(lVar1 + 0x6c); local_20 = local_20 + 1) {
      if (*(int *)(lVar1 + 0x1c) != 0) {
        *(double *)(lVar3 + (long)local_24 * 8) =
             *(double *)(in_RDI + 0x2c0) *
             (*(double *)(*(long *)(*(long *)(lVar1 + 0x70) + 0x20) + (long)local_20 * 8) -
             *(double *)(*(long *)(*(long *)(lVar1 + 0x70) + 0x28) + (long)local_20 * 8));
        *(undefined8 *)(lVar4 + (long)local_24 * 8) =
             *(undefined8 *)(*(long *)(lVar1 + 0x30) + (long)local_20 * 8);
        local_24 = local_24 + 1;
      }
      if (*(int *)(lVar1 + 0x20) != 0) {
        *(double *)(lVar3 + (long)local_24 * 8) =
             *(double *)(in_RDI + 0x2c0) *
             (*(double *)(*(long *)(*(long *)(lVar1 + 0x78) + 0x20) + (long)local_20 * 8) -
             *(double *)(*(long *)(*(long *)(lVar1 + 0x78) + 0x28) + (long)local_20 * 8));
        *(undefined8 *)(lVar4 + (long)local_24 * 8) =
             *(undefined8 *)(*(long *)(lVar1 + 0x38) + (long)local_20 * 8);
        local_24 = local_24 + 1;
      }
    }
    iVar5 = N_VLinearCombination(local_24,lVar3,lVar4,uVar2);
    if (iVar5 != 0) {
      return -0x1c;
    }
    iVar5 = (**(code **)(lVar1 + 0x168))(*(undefined8 *)(lVar1 + 0xf0),in_RDI,uVar2);
    if (iVar5 < 0) {
      *in_RSI = 0x4000000000000000;
      return 4;
    }
    uVar7 = N_VWrmsNorm(uVar2,*(undefined8 *)(in_RDI + 0x230));
    *in_RSI = uVar7;
  }
  return 0;
}

Assistant:

int arkStep_ComputeSolutions_MassFixed(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunbooleantype stiffly_accurate;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* check if the method is stiffly accurate */
  stiffly_accurate = SUNTRUE;

  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* If the method is stiffly accurate, ycur is already the new solution */

  if (!stiffly_accurate)
  {
    /* compute y RHS (store in y) */
    /*   set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /*   call fused vector operation to compute RHS */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* solve for y update (stored in y) */
    retval = step_mem->msolve((void*)ark_mem, y, step_mem->nlscoef);
    if (retval < 0)
    {
      *dsmPtr = SUN_RCONST(2.0); /* indicate too much error, step with smaller step */
      N_VScale(ONE, ark_mem->yn, y); /* place old solution into y */
      return (CONV_FAIL);
    }

    /* compute y = yn + update */
    N_VLinearSum(ONE, ark_mem->yn, ONE, y, y);
  }

  /* compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    /* compute yerr RHS vector */
    /*   set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /*   call fused vector operation to compute yerr RHS */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* solve for yerr */
    retval = step_mem->msolve((void*)ark_mem, yerr, step_mem->nlscoef);
    if (retval < 0)
    {
      *dsmPtr = SUN_RCONST(2.0); /* next attempt will reduce step by 'etacf';
                                 insert dsmPtr placeholder here */
      return (CONV_FAIL);
    }
    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}